

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

boolean lava_effects(void)

{
  obj *poVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool local_27;
  boolean usurvive;
  int dmg;
  obj *obj2;
  obj *obj;
  
  burn_away_slime();
  if ((youmonst.data == mons + 0xa0) || (youmonst.data == mons + 0x157)) {
    return '\0';
  }
  if ((((u.uprops[1].intrinsic == 0) && (u.uprops[1].extrinsic == 0)) &&
      ((youmonst.mintrinsics & 1) == 0)) ||
     ((((u.uprops[1].intrinsic & 0x4000000) != 0 && ((u.uprops[1].intrinsic & 0xfbffffff) == 0)) &&
      ((u.uprops[1].extrinsic == 0 && ((youmonst.mintrinsics & 1) == 0)))))) {
    if (((u.uprops[0x27].extrinsic == 0) ||
        (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) &&
       (((u.uprops[1].intrinsic & 0x4000000) == 0 ||
        ((((u.uprops[1].intrinsic & 0xfbffffff) != 0 || (u.uprops[1].extrinsic != 0)) ||
         ((youmonst.mintrinsics & 1) != 0)))))) {
      pline("You fall into the lava!");
    }
    else {
      bVar7 = false;
      if ((((u.uprops[1].intrinsic & 0x4000000) != 0) &&
          (bVar7 = false, (u.uprops[1].intrinsic & 0xfbffffff) == 0)) &&
         (bVar7 = false, u.uprops[1].extrinsic == 0)) {
        bVar7 = (youmonst.mintrinsics & 1) == 0;
      }
      iVar3 = 6;
      if (bVar7) {
        iVar3 = 3;
      }
      iVar3 = dice(6,iVar3);
      pline("The lava here burns you!");
      if (iVar3 < u.uhp) {
        losehp(iVar3,"molten lava",1);
        goto LAB_00311b25;
      }
    }
    local_27 = u.uprops[0x2b].extrinsic != 0 || flags.explore != '\0';
    if (flags.debug != '\0') {
      local_27 = true;
    }
    obj2 = invent;
    poVar1 = obj2;
    while (obj2 = poVar1, obj2 != (obj *)0x0) {
      poVar1 = obj2->nobj;
      if (((*(ushort *)&objects[obj2->otyp].field_0x11 >> 4 & 0x1f) < 9) &&
         ((*(uint *)&obj2->field_0x4a >> 0xc & 1) == 0)) {
        if (obj2->otyp == 0x1bd) {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && (local_27)) {
            pcVar6 = xname(obj2);
            pcVar6 = The(pcVar6);
            pcVar5 = hcolor("dark red");
            pline("%s glows a strange %s, but remains intact.",pcVar6,pcVar5);
          }
        }
        else {
          if (obj2->owornmask != 0) {
            if (local_27) {
              aobjnam(obj2,"burst");
              pline("Your %s into flame!");
            }
            if (obj2 == uarm) {
              Armor_gone((local_27 ^ 0xffU) & 1);
            }
            else if (obj2 == uarmc) {
              Cloak_off();
            }
            else if (obj2 == uarmh) {
              Helmet_off();
            }
            else if (obj2 == uarms) {
              Shield_off();
            }
            else if (obj2 == uarmg) {
              Gloves_off();
            }
            else if (obj2 == uarmf) {
              Boots_off();
            }
            else if (obj2 == uarmu) {
              Shirt_off();
            }
            else if (obj2 == uleft) {
              Ring_gone(obj2);
            }
            else if (obj2 == uright) {
              Ring_gone(obj2);
            }
            else if (obj2 == ublindf) {
              Blindf_off(obj2,'\0');
            }
            else if (obj2 == uamul) {
              Amulet_off();
            }
            else if (obj2 == uwep) {
              uwepgone();
            }
            else if (obj2 == uquiver) {
              uqwepgone();
            }
            else if (obj2 == uswapwep) {
              uswapwepgone();
            }
          }
          useupall(obj2);
        }
      }
    }
    u.uhp = -1;
    killer_format = 1;
    killer = "molten lava";
    pline("You burn to a crisp...");
    done(5);
    while (bVar2 = safe_teleds('\x01'), bVar2 == '\0') {
      pline("You\'re still burning.");
      done(5);
    }
    pcVar6 = surface((int)u.ux,(int)u.uy);
    pline("You find yourself back on solid %s.",pcVar6);
    obj._7_1_ = '\x01';
  }
  else {
LAB_00311b25:
    if ((u.uprops[0x27].extrinsic == 0) ||
       (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
      iVar3 = rn2(4);
      iVar4 = rn2(4);
      u.utrap = iVar3 + 4 + (iVar4 + 0xc) * 0x100;
      u.utraptype = 3;
      if ((u.uprops[1].intrinsic != 0) ||
         ((u.uprops[1].extrinsic != 0 || (bVar7 = false, (youmonst.mintrinsics & 1) != 0)))) {
        bVar7 = false;
        if (((u.uprops[1].intrinsic & 0x4000000) != 0) &&
           ((bVar7 = false, (u.uprops[1].intrinsic & 0xfbffffff) == 0 &&
            (bVar7 = false, u.uprops[1].extrinsic == 0)))) {
          bVar7 = (youmonst.mintrinsics & 1) == 0;
        }
        bVar7 = (bool)(bVar7 ^ 1);
      }
      pcVar6 = "";
      if (bVar7) {
        pcVar6 = ", but it only burns slightly";
      }
      pline("You sink into the lava%s!",pcVar6);
      if (1 < u.uhp) {
        losehp(1,"molten lava",1);
      }
    }
    poVar1 = uarmf;
    if (((uarmf != (obj *)0x0) && ((*(uint *)&uarmf->field_0x4a >> 0xc & 1) == 0)) &&
       ((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) < 9)) {
      pcVar6 = xname(uarmf);
      pline("Your %s bursts into flame!",pcVar6);
      Boots_off();
      useup(poVar1);
    }
    destroy_item(9,2);
    destroy_item(10,2);
    destroy_item(8,2);
    obj._7_1_ = '\0';
  }
  return obj._7_1_;
}

Assistant:

boolean lava_effects(void)
{
    struct obj *obj, *obj2;
    int dmg;
    boolean usurvive;

    burn_away_slime();
    if (likes_lava(youmonst.data)) return FALSE;

    if (!FFire_resistance) {
	if (Wwalking || PFire_resistance) {
	    dmg = dice(6, PFire_resistance ? 3 : 6);
	    pline("The lava here burns you!");
	    if (dmg < u.uhp) {
		losehp(dmg, lava_killer, KILLED_BY);
		goto sink_in;
	    }
	} else {
	    pline("You fall into the lava!");
	}

	usurvive = Lifesaved || discover;
	if (wizard)
		usurvive = TRUE;
	
	for (obj = invent; obj; obj = obj2) {
	    obj2 = obj->nobj;
	    if (is_organic(obj) && !obj->oerodeproof) {
		/* Prevent the Book of the Dead from being destroyed when
		 * the player falls into lava. */
		if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
		    if (!Blind && usurvive) {
			pline("%s glows a strange %s, but remains intact.",
			      The(xname(obj)), hcolor("dark red"));
		    }
		    continue;
		}
		if (obj->owornmask) {
		    if (usurvive)
			pline("Your %s into flame!", aobjnam(obj, "burst"));

		    if (obj == uarm) Armor_gone(!usurvive);
		    else if (obj == uarmc) Cloak_off();
		    else if (obj == uarmh) Helmet_off();
		    else if (obj == uarms) Shield_off();
		    else if (obj == uarmg) Gloves_off();
		    else if (obj == uarmf) Boots_off();
		    else if (obj == uarmu) Shirt_off();
		    else if (obj == uleft) Ring_gone(obj);
		    else if (obj == uright) Ring_gone(obj);
		    else if (obj == ublindf) Blindf_off(obj, FALSE);
		    else if (obj == uamul) Amulet_off();
		    else if (obj == uwep) uwepgone();
		    else if (obj == uquiver) uqwepgone();
		    else if (obj == uswapwep) uswapwepgone();
		}
		useupall(obj);
	    }
	}

	/* s/he died... */
	u.uhp = -1;
	killer_format = KILLED_BY;
	killer = lava_killer;
	pline("You burn to a crisp...");
	done(BURNING);
	while (!safe_teleds(TRUE)) {
		pline("You're still burning.");
		done(BURNING);
	}
	pline("You find yourself back on solid %s.", surface(u.ux, u.uy));
	return TRUE;
    }

 sink_in:
    if (!Wwalking) {
	u.utrap = rn1(4, 4) + (rn1(4, 12) << 8);
	u.utraptype = TT_LAVA;
	pline("You sink into the lava%s!",
	      FFire_resistance ? ", but it only burns slightly" : "");
	if (u.uhp > 1)
	    losehp(1, lava_killer, KILLED_BY);
    }
    /* just want to burn boots, not all armor; destroy_item doesn't work on
       armor anyway */
    if (uarmf && !uarmf->oerodeproof && is_organic(uarmf)) {
	/* save uarmf value because Boots_off() sets uarmf to null */
	obj = uarmf;
	pline("Your %s bursts into flame!", xname(obj));
	Boots_off();
	useup(obj);
    }
    destroy_item(SCROLL_CLASS, AD_FIRE);
    destroy_item(SPBOOK_CLASS, AD_FIRE);
    destroy_item(POTION_CLASS, AD_FIRE);
    return FALSE;
}